

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tui_fileselect.cc
# Opt level: O0

void __thiscall File_Selector::setup_display(File_Selector *this,WINDOW *outer)

{
  int iVar1;
  int iVar2;
  pointer pIVar3;
  WINDOW *pWVar4;
  Windows local_30;
  WINDOW *local_18;
  WINDOW *outer_local;
  File_Selector *this_local;
  
  local_18 = outer;
  outer_local = (WINDOW *)this;
  memset(&local_30,0,0x18);
  Impl::Windows::Windows(&local_30);
  pIVar3 = std::unique_ptr<File_Selector::Impl,_std::default_delete<File_Selector::Impl>_>::
           operator->(&this->P);
  Impl::Windows::operator=(&pIVar3->win,&local_30);
  Impl::Windows::~Windows(&local_30);
  pWVar4 = local_18;
  pIVar3 = std::unique_ptr<File_Selector::Impl,_std::default_delete<File_Selector::Impl>_>::
           operator->(&this->P);
  (pIVar3->win).outer_ = pWVar4;
  if (local_18 != (WINDOW *)0x0) {
    pIVar3 = std::unique_ptr<File_Selector::Impl,_std::default_delete<File_Selector::Impl>_>::
             operator->(&this->P);
    pWVar4 = local_18;
    iVar1 = getcols(local_18);
    pWVar4 = derwin_s(pWVar4,1,iVar1 + -2,1,1);
    std::unique_ptr<_win_st,_WINDOW_deleter>::reset(&(pIVar3->win).title_,pWVar4);
    pIVar3 = std::unique_ptr<File_Selector::Impl,_std::default_delete<File_Selector::Impl>_>::
             operator->(&this->P);
    pWVar4 = local_18;
    iVar1 = getrows(local_18);
    iVar2 = getcols(local_18);
    pWVar4 = derwin_s(pWVar4,iVar1 + -4,iVar2 + -2,3,1);
    std::unique_ptr<_win_st,_WINDOW_deleter>::reset(&(pIVar3->win).inner_,pWVar4);
  }
  return;
}

Assistant:

void File_Selector::setup_display(WINDOW *outer)
{
    P->win = Impl::Windows();
    P->win.outer_ = outer;

    if (!outer)
        return;

    P->win.title_.reset(derwin_s(outer, 1, getcols(outer) - 2, 1, 1));
    P->win.inner_.reset(derwin_s(outer, getrows(outer) - 4, getcols(outer) - 2, 3, 1));
}